

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O2

XXH_INLINE_XXH128_hash_t XXH_INLINE_XXH128(void *input,size_t len,XXH64_hash_t seed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  XXH_INLINE_XXH128_hash_t XVar5;
  XXH_INLINE_XXH128_hash_t XVar6;
  ulong uVar7;
  size_t in_RCX;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  xxh_u8 *pxVar13;
  xxh_u8 *pxVar14;
  bool bVar15;
  XXH_INLINE_XXH128_hash_t acc;
  XXH_INLINE_XXH128_hash_t acc_00;
  XXH_INLINE_XXH128_hash_t acc_01;
  XXH_INLINE_XXH128_hash_t acc_02;
  XXH_INLINE_XXH128_hash_t XVar16;
  XXH_INLINE_XXH128_hash_t acc_03;
  xxh_u8 local_f0 [192];
  
  if (0x10 < len) {
    if (len < 0x81) {
      acc_03.low64 = len * -0x61c8864e7a143579;
      if (len < 0x21) {
        acc_02.high64 = 0;
        acc_02.low64 = acc_03.low64;
      }
      else {
        if (len < 0x41) {
          acc_01.high64 = 0;
          acc_01.low64 = acc_03.low64;
        }
        else {
          if (len < 0x61) {
            acc.high64 = 0;
            acc.low64 = acc_03.low64;
          }
          else {
            acc_03.high64 = 0;
            acc = XXH128_mix32B(acc_03,(xxh_u8 *)((long)input + 0x30),
                                (xxh_u8 *)((long)input + (len - 0x40)),kSecret + 0x60,seed);
          }
          acc_01 = XXH128_mix32B(acc,(xxh_u8 *)((long)input + 0x20),
                                 (xxh_u8 *)((long)input + (len - 0x30)),kSecret + 0x40,seed);
        }
        acc_02 = XXH128_mix32B(acc_01,(xxh_u8 *)((long)input + 0x10),
                               (xxh_u8 *)((long)input + (len - 0x20)),kSecret + 0x20,seed);
      }
      XVar16 = XXH128_mix32B(acc_02,(xxh_u8 *)input,(xxh_u8 *)((long)input + (len - 0x10)),kSecret,
                             seed);
      uVar11 = XVar16.low64 + XVar16.high64;
      uVar11 = (uVar11 >> 0x25 ^ uVar11) * 0x165667919e3779f9;
      uVar7 = (len - seed) * -0x3d4d51c2d82b14b1 + XVar16.high64 * -0x7a1435883d4d519d +
              XVar16.low64 * -0x61c8864e7a143579;
      uVar11 = uVar11 >> 0x20 ^ uVar11;
      uVar7 = (uVar7 >> 0x25 ^ uVar7) * 0x165667919e3779f9;
      uVar7 = uVar7 >> 0x20 ^ uVar7;
    }
    else {
      if (0xf0 < len) {
        if (seed == 0) {
          pxVar14 = kSecret;
        }
        else {
          pxVar14 = local_f0;
          XXH3_initCustomSecret(pxVar14,seed);
        }
        XVar16 = XXH3_hashLong_128b_internal((xxh_u8 *)input,len,pxVar14,in_RCX);
        return XVar16;
      }
      pxVar13 = kSecret;
      lVar8 = 4;
      XVar16.high64 = 0;
      XVar16.low64 = len * -0x61c8864e7a143579;
      pxVar14 = (xxh_u8 *)input;
      while( true ) {
        bVar15 = lVar8 == 0;
        lVar8 = lVar8 + -1;
        if (bVar15) break;
        XVar16 = XXH128_mix32B(XVar16,pxVar14,pxVar14 + 0x10,pxVar13,seed);
        pxVar13 = pxVar13 + 0x20;
        pxVar14 = pxVar14 + 0x20;
      }
      pxVar14 = (xxh_u8 *)((long)input + 0x80);
      pxVar13 = kSecret + 3;
      lVar8 = (len >> 5) - 4;
      uVar11 = (XVar16.low64 >> 0x25 ^ XVar16.low64) * 0x165667919e3779f9;
      uVar7 = (XVar16.high64 >> 0x25 ^ XVar16.high64) * 0x165667919e3779f9;
      acc_00.high64 = uVar7 >> 0x20 ^ uVar7;
      acc_00.low64 = uVar11 >> 0x20 ^ uVar11;
      while (bVar15 = lVar8 != 0, lVar8 = lVar8 + -1, bVar15) {
        acc_00 = XXH128_mix32B(acc_00,pxVar14,pxVar14 + 0x10,pxVar13,seed);
        pxVar13 = pxVar13 + 0x20;
        pxVar14 = pxVar14 + 0x20;
      }
      XVar16 = XXH128_mix32B(acc_00,(xxh_u8 *)((long)input + (len - 0x10)),
                             (xxh_u8 *)((long)input + (len - 0x20)),kSecret + 0x67,-seed);
      uVar11 = XVar16.low64 + XVar16.high64;
      uVar11 = (uVar11 >> 0x25 ^ uVar11) * 0x165667919e3779f9;
      uVar7 = (len - seed) * -0x3d4d51c2d82b14b1 + XVar16.high64 * -0x7a1435883d4d519d +
              XVar16.low64 * -0x61c8864e7a143579;
      uVar11 = uVar11 >> 0x20 ^ uVar11;
      uVar7 = (uVar7 >> 0x25 ^ uVar7) * 0x165667919e3779f9;
      uVar7 = uVar7 >> 0x20 ^ uVar7;
    }
    XVar6.high64 = -uVar7;
    XVar6.low64 = uVar11;
    return XVar6;
  }
  if (len < 9) {
    if (3 < len) {
      uVar9 = (uint)seed;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = ((ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                             uVar9 << 0x18) << 0x20 ^ seed) + 0xc4f023344dc994ac ^
                     CONCAT44(*(undefined4 *)((long)input + (len - 4)),*input);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = len * 4 + 0x9e3779b185ebca87;
      uVar7 = SUB168(auVar3 * auVar4,0);
      uVar11 = SUB168(auVar3 * auVar4,8) + uVar7 * 2;
      uVar7 = uVar11 >> 3 ^ uVar7;
      uVar7 = (uVar7 >> 0x23 ^ uVar7) * -0x604de39ae16720db;
      uVar7 = uVar7 >> 0x1c ^ uVar7;
      goto LAB_00108c04;
    }
    if (len == 0) {
      uVar11 = seed + 0x9e3779b185ebca87 ^ 0x682e908a3037f8b4;
      uVar7 = (uVar11 >> 0x25 ^ uVar11) * 0x165667919e3779f9;
      uVar7 = uVar7 >> 0x20 ^ uVar7;
      uVar11 = 0xc2b2ae3d27d4eb4f - seed ^ 0x9655d30bd1a77d49;
      goto LAB_00108c04;
    }
    uVar9 = (int)len << 8;
    uVar10 = uVar9 | (uint)*input << 0x10 | (uint)*(byte *)((long)input + (len >> 1)) << 0x18;
    uVar12 = (uint)*(byte *)((long)input + (len - 1));
    uVar9 = uVar10 >> 0x18 | (uVar9 & 0xff0000 | (uint)*input << 0x10) >> 8 | (uVar9 & 0xff00) << 8;
    uVar7 = ((ulong)(uVar10 | uVar12) ^ seed + 0x87275a9b) * -0x61c8864e7a143579;
    uVar11 = ((ulong)((uVar9 | uVar12 << 0x18) >> 0x13 | uVar9 << 0xd) ^ 0x302c208b - seed) *
             0x27d4eb2f165667c5;
    uVar7 = uVar7 >> 0x25 ^ uVar7;
  }
  else {
    uVar11 = *(ulong *)((long)input + (len - 8));
    uVar7 = seed + 0xc202797692d63d58 ^ uVar11;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = 0x59973f0033362349 - seed ^ *input ^ uVar11;
    uVar11 = (uVar7 & 0xffffffff) * 0x85ebca76 + uVar7 +
             SUB168(auVar1 * ZEXT816(0x9e3779b185ebca87),8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                    (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8 |
                    (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18 |
                    (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38) ^
                   (len << 0x36) + -0x40000000000000 +
                   SUB168(auVar1 * ZEXT816(0x9e3779b185ebca87),0);
    uVar7 = SUB168(auVar2 * ZEXT816(0xc2b2ae3d27d4eb4f),0);
    uVar11 = uVar11 * -0x3d4d51c2d82b14b1 + SUB168(auVar2 * ZEXT816(0xc2b2ae3d27d4eb4f),8);
    uVar7 = uVar7 >> 0x25 ^ uVar7;
  }
  uVar7 = uVar7 * 0x165667919e3779f9 >> 0x20 ^ uVar7 * 0x165667919e3779f9;
LAB_00108c04:
  uVar11 = (uVar11 >> 0x25 ^ uVar11) * 0x165667919e3779f9;
  XVar5.high64 = uVar11 >> 0x20 ^ uVar11;
  XVar5.low64 = uVar7;
  return XVar5;
}

Assistant:

XXH_PUBLIC_API XXH128_hash_t
XXH128(const void* input, size_t len, XXH64_hash_t seed)
{
    return XXH3_128bits_withSeed(input, len, seed);
}